

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_test.cpp
# Opt level: O2

void __thiscall
ContextTest_StringFormatWithEmptyContext_Test::TestBody
          (ContextTest_StringFormatWithEmptyContext_Test *this)

{
  char *message;
  allocator local_382;
  allocator local_381;
  CcsDomain ccs;
  AssertionResult gtest_ar;
  CcsContext local_368;
  undefined1 local_358 [8];
  string local_350;
  CcsContext ctx;
  CcsContext root;
  __shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> local_310;
  ostringstream os;
  istringstream input;
  
  ::ccs::CcsDomain::CcsDomain(&ccs,false);
  std::__cxx11::string::string((string *)&os,"b c : @constrain d.e",(allocator *)(local_358 + 8));
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&os,_S_in);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&os,"<literal>",(allocator *)(local_358 + 8));
  ::ccs::CcsDomain::loadCcsStream
            (&ccs,(istream *)&input,(string *)&os,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&os);
  ::ccs::CcsDomain::build((CcsDomain *)&root);
  std::__cxx11::string::string((string *)&os,"c",&local_381);
  ::ccs::CcsContext::CcsContext(&local_368,&root,(string *)&os);
  ::ccs::CcsContext::builder((CcsContext *)local_358);
  ::ccs::CcsContext::Builder::build((Builder *)&gtest_ar);
  std::__cxx11::string::string((string *)(local_358 + 8),"b",&local_382);
  ::ccs::CcsContext::CcsContext(&ctx,(CcsContext *)&gtest_ar,(string *)(local_358 + 8));
  std::__cxx11::string::~string((string *)(local_358 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  ::ccs::CcsContext::Builder::~Builder((Builder *)local_358);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_368.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_310,(__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> *)&ctx);
  ::ccs::operator<<((ostream *)&os,(CcsContext *)&local_310);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_310._M_refcount);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"c > b/d.e\"","os.str()",(char (*) [10])0x1632c4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_358 + 8));
  std::__cxx11::string::~string((string *)(local_358 + 8));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)(local_358 + 8));
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/context_test.cpp"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_368,(Message *)(local_358 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._M_dataplus._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(*(_func_int ***)local_350._M_dataplus._M_p)[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  ::ccs::CcsDomain::~CcsDomain(&ccs);
  return;
}

Assistant:

TEST(ContextTest, StringFormatWithEmptyContext) {
  CcsDomain ccs;
  std::istringstream input("b c : @constrain d.e");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();
  CcsContext ctx = root.constrain("c").builder().build().constrain("b");
  std::ostringstream os;
  os << ctx;
  EXPECT_EQ("c > b/d.e", os.str());
}